

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
mpt::reference<mpt::layout>::reference(reference<mpt::layout> *this,reference<mpt::layout> *ref)

{
  reference<mpt::layout> *ref_local;
  reference<mpt::layout> *this_local;
  
  this->_ref = (layout *)0x0;
  operator=(this,ref);
  return;
}

Assistant:

inline reference(const reference &ref) : _ref(0)
	{
		*this = ref;
	}